

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O1

int nng_args_parse(int argc,char **argv,nng_arg_spec *specs,int *val,char **optarg,int *optidx)

{
  char cVar1;
  int iVar2;
  char *__s2;
  nng_arg_spec *pnVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  nng_arg_spec *pnVar8;
  size_t __n;
  nng_arg_spec *local_40;
  int local_38;
  int local_34;
  
  iVar2 = *optidx;
  iVar4 = -1;
  if (iVar2 < argc) {
    pcVar7 = argv[iVar2];
    if (*pcVar7 == '-') {
      cVar1 = pcVar7[1];
      if (cVar1 == '\0') {
        *optidx = iVar2 + 1;
      }
      else {
        if (cVar1 == '-') {
          pcVar7 = pcVar7 + 2;
          __n = 0;
          while ((0x3d < (ulong)(byte)pcVar7[__n] ||
                 ((0x2400000000000001U >> ((ulong)(byte)pcVar7[__n] & 0x3f) & 1) == 0))) {
            __n = __n + 1;
          }
        }
        else {
          pcVar7 = pcVar7 + 1;
          __n = 1;
        }
        if (specs->a_val == 0) {
          local_40 = (nng_arg_spec *)0x0;
          local_34 = 0;
        }
        else {
          lVar6 = 0;
          local_34 = 0;
          local_40 = (nng_arg_spec *)0x0;
          pnVar8 = specs;
          do {
            if (cVar1 == '-') {
              __s2 = pnVar8->a_name;
              if ((__s2 != (char *)0x0) && (iVar4 = strncmp(pcVar7,__s2,__n), iVar4 == 0)) {
                sVar5 = strlen(__s2);
                local_40 = pnVar8;
                if (sVar5 == __n) {
                  local_34 = 1;
                  break;
                }
                local_34 = local_34 + 1;
              }
            }
            else if (pnVar8->a_short == (int)*pcVar7) {
              local_40 = specs + lVar6;
              local_34 = 1;
              break;
            }
            lVar6 = lVar6 + 1;
            pnVar3 = pnVar8 + 1;
            pnVar8 = pnVar8 + 1;
          } while (pnVar3->a_val != 0);
        }
        iVar4 = -2;
        if (local_34 != 0) {
          if (local_34 == 1) {
            if (local_40->a_arg == false) {
              if (pcVar7[__n] != '\0') {
                return -2;
              }
              *val = local_40->a_val;
              *optidx = iVar2 + 1;
            }
            else {
              if (pcVar7[__n] == '\0') {
                local_38 = iVar2 + 1;
                if (argc <= local_38) {
                  return -4;
                }
                pcVar7 = argv[(long)iVar2 + 1];
              }
              else {
                pcVar7 = pcVar7 + (cVar1 == '-') + __n;
                local_38 = iVar2;
              }
              *optarg = pcVar7;
              *optidx = local_38 + 1;
              *val = local_40->a_val;
            }
            iVar4 = 0;
          }
          else {
            iVar4 = -3;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
nng_args_parse(int argc, char *const *argv, const nng_arg_spec *specs,
    int *val, char **optarg, int *optidx)
{
	const nng_arg_spec *spec;
	int                 matches;
	bool                shortopt;
	size_t              l;
	char               *arg;
	int                 i;

	if ((i = *optidx) >= argc) {
		return (-1);
	}
	arg = argv[*optidx];

	if (arg[0] != '-') {
		return (-1);
	}
	if (arg[1] == '\0') {
		*optidx = i + 1;
		return (-1);
	}

	if ((arg[0] == '-') && (arg[1] == '-')) {
		arg += 2;
		shortopt = false;
		for (l = 0; arg[l] != '\0'; l++) {
			if ((arg[l] == '=') || (arg[l] == ':')) {
				break;
			}
		}
	} else {
		arg++;
		shortopt = true;
		l        = 1;
	}

	matches = 0;
	spec    = NULL;

	for (int x = 0; specs[x].a_val != 0; x++) {

		if (shortopt) {
			if (arg[0] == specs[x].a_short) {
				matches = 1;
				spec    = &specs[x];
				break;
			}
			continue;
		}

		if ((specs[x].a_name == NULL) ||
		    (strncmp(arg, specs[x].a_name, l) != 0)) {
			continue;
		}
		matches++;
		spec = &specs[x];

		if (strlen(specs[x].a_name) == l) {
			// Perfect match.
			matches = 1;
			break;
		}
	}

	switch (matches) {
	case 1:
		// Exact match
		break;
	case 0:
		// No such option
		return (NNG_ARG_INVAL);
		break;
	default:
		// Ambiguous (not match)
		return (NNG_ARG_AMBIG);
		break;
	}

	if (!spec->a_arg) {
		// No option clustering for short options yet.
		if (arg[l] != '\0') {
			return (NNG_ARG_INVAL);
		}
		*val    = spec->a_val;
		*optidx = i + 1;
		return (0);
	}

	if (arg[l] != '\0') {
		if (shortopt) {
			*optarg = arg + l;
		} else {
			*optarg = arg + l + 1;
		}
	} else {
		i++;
		if (i >= argc) {
			return (NNG_ARG_MISSING);
		}
		*optarg = argv[i];
	}
	*optidx = ++i;
	*val    = spec->a_val;

	return (0);
}